

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O0

void __thiscall
p2t::SweepContext::CreateAdvancingFront
          (SweepContext *this,vector<p2t::Node_*,_std::allocator<p2t::Node_*>_> *nodes)

{
  Triangle *this_00;
  reference ppPVar1;
  Node *pNVar2;
  Point *pPVar3;
  AdvancingFront *this_01;
  Triangle *local_20;
  Triangle *triangle;
  vector<p2t::Node_*,_std::allocator<p2t::Node_*>_> *nodes_local;
  SweepContext *this_local;
  
  triangle = (Triangle *)nodes;
  nodes_local = (vector<p2t::Node_*,_std::allocator<p2t::Node_*>_> *)this;
  this_00 = (Triangle *)operator_new(0x40);
  ppPVar1 = std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::operator[](&this->points_,0);
  Triangle::Triangle(this_00,*ppPVar1,this->tail_,this->head_);
  local_20 = this_00;
  std::__cxx11::list<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::push_back
            (&this->map_,&local_20);
  pNVar2 = (Node *)operator_new(0x28);
  pPVar3 = Triangle::GetPoint(local_20,1);
  p2t::Node::Node(pNVar2,pPVar3,local_20);
  this->af_head_ = pNVar2;
  pNVar2 = (Node *)operator_new(0x28);
  pPVar3 = Triangle::GetPoint(local_20,0);
  p2t::Node::Node(pNVar2,pPVar3,local_20);
  this->af_middle_ = pNVar2;
  pNVar2 = (Node *)operator_new(0x28);
  pPVar3 = Triangle::GetPoint(local_20,2);
  p2t::Node::Node(pNVar2,pPVar3);
  this->af_tail_ = pNVar2;
  this_01 = (AdvancingFront *)operator_new(0x18);
  AdvancingFront::AdvancingFront(this_01,this->af_head_,this->af_tail_);
  this->front_ = this_01;
  this->af_head_->next = this->af_middle_;
  this->af_middle_->next = this->af_tail_;
  this->af_middle_->prev = this->af_head_;
  this->af_tail_->prev = this->af_middle_;
  return;
}

Assistant:

void SweepContext::CreateAdvancingFront(const std::vector<Node*>& nodes)
{

  (void) nodes;
  // Initial triangle
  Triangle* triangle = new Triangle(*points_[0], *tail_, *head_);

  map_.push_back(triangle);

  af_head_ = new Node(*triangle->GetPoint(1), *triangle);
  af_middle_ = new Node(*triangle->GetPoint(0), *triangle);
  af_tail_ = new Node(*triangle->GetPoint(2));
  front_ = new AdvancingFront(*af_head_, *af_tail_);

  // TODO: More intuitive if head is middles next and not previous?
  //       so swap head and tail
  af_head_->next = af_middle_;
  af_middle_->next = af_tail_;
  af_middle_->prev = af_head_;
  af_tail_->prev = af_middle_;
}